

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O2

int spng_set_srgb(spng_ctx *ctx,uint8_t rendering_intent)

{
  ulong uVar1;
  int iVar2;
  
  iVar2 = 1;
  if (ctx != (spng_ctx *)0x0) {
    if ((ctx->data == (uchar *)0x0) && ((ctx->field_0xcc & 0x10) == 0)) {
      iVar2 = 0x52;
    }
    else {
      iVar2 = read_chunks(ctx,0);
      if ((iVar2 == 0) && (iVar2 = 1, rendering_intent < 4)) {
        ctx->srgb_rendering_intent = rendering_intent;
        uVar1._0_4_ = ctx->user;
        uVar1._4_4_ = ctx->stored;
        ctx->user = (spng_chunk_bitfield)(int)(uVar1 | 0x4000000040);
        ctx->stored = (spng_chunk_bitfield)(int)((uVar1 | 0x4000000040) >> 0x20);
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int spng_set_srgb(spng_ctx *ctx, uint8_t rendering_intent)
{
    SPNG_SET_CHUNK_BOILERPLATE(ctx);

    if(rendering_intent > 3) return 1;

    ctx->srgb_rendering_intent = rendering_intent;

    ctx->stored.srgb = 1;
    ctx->user.srgb = 1;

    return 0;
}